

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O0

int pem_pbkdf1(uchar *key,size_t keylen,uchar *iv,uchar *pwd,size_t pwdlen)

{
  int local_a4;
  size_t sStack_a0;
  int ret;
  size_t use_len;
  uchar md5sum [16];
  mbedtls_md5_context md5_ctx;
  size_t pwdlen_local;
  uchar *pwd_local;
  uchar *iv_local;
  size_t keylen_local;
  uchar *key_local;
  
  mbedtls_md5_init((mbedtls_md5_context *)(md5sum + 8));
  local_a4 = mbedtls_md5_starts_ret((mbedtls_md5_context *)(md5sum + 8));
  if ((((local_a4 == 0) &&
       (local_a4 = mbedtls_md5_update_ret((mbedtls_md5_context *)(md5sum + 8),pwd,pwdlen),
       local_a4 == 0)) &&
      (local_a4 = mbedtls_md5_update_ret((mbedtls_md5_context *)(md5sum + 8),iv,8), local_a4 == 0))
     && (local_a4 = mbedtls_md5_finish_ret((mbedtls_md5_context *)(md5sum + 8),(uchar *)&use_len),
        local_a4 == 0)) {
    if (keylen < 0x11) {
      memcpy(key,&use_len,keylen);
    }
    else {
      *(size_t *)key = use_len;
      *(undefined8 *)(key + 8) = md5sum._0_8_;
      local_a4 = mbedtls_md5_starts_ret((mbedtls_md5_context *)(md5sum + 8));
      if (((local_a4 == 0) &&
          (local_a4 = mbedtls_md5_update_ret
                                ((mbedtls_md5_context *)(md5sum + 8),(uchar *)&use_len,0x10),
          local_a4 == 0)) &&
         ((local_a4 = mbedtls_md5_update_ret((mbedtls_md5_context *)(md5sum + 8),pwd,pwdlen),
          local_a4 == 0 &&
          ((local_a4 = mbedtls_md5_update_ret((mbedtls_md5_context *)(md5sum + 8),iv,8),
           local_a4 == 0 &&
           (local_a4 = mbedtls_md5_finish_ret((mbedtls_md5_context *)(md5sum + 8),(uchar *)&use_len)
           , local_a4 == 0)))))) {
        sStack_a0 = 0x10;
        if (keylen < 0x20) {
          sStack_a0 = keylen - 0x10;
        }
        memcpy(key + 0x10,&use_len,sStack_a0);
      }
    }
  }
  mbedtls_md5_free((mbedtls_md5_context *)(md5sum + 8));
  mbedtls_platform_zeroize(&use_len,0x10);
  return local_a4;
}

Assistant:

static int pem_pbkdf1( unsigned char *key, size_t keylen,
                       unsigned char *iv,
                       const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_md5_context md5_ctx;
    unsigned char md5sum[16];
    size_t use_len;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    mbedtls_md5_init( &md5_ctx );

    /*
     * key[ 0..15] = MD5(pwd || IV)
     */
    if( ( ret = mbedtls_md5_starts_ret( &md5_ctx ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, pwd, pwdlen ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, iv,  8 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_finish_ret( &md5_ctx, md5sum ) ) != 0 )
        goto exit;

    if( keylen <= 16 )
    {
        memcpy( key, md5sum, keylen );
        goto exit;
    }

    memcpy( key, md5sum, 16 );

    /*
     * key[16..23] = MD5(key[ 0..15] || pwd || IV])
     */
    if( ( ret = mbedtls_md5_starts_ret( &md5_ctx ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, md5sum, 16 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, pwd, pwdlen ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_update_ret( &md5_ctx, iv, 8 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_md5_finish_ret( &md5_ctx, md5sum ) ) != 0 )
        goto exit;

    use_len = 16;
    if( keylen < 32 )
        use_len = keylen - 16;

    memcpy( key + 16, md5sum, use_len );

exit:
    mbedtls_md5_free( &md5_ctx );
    mbedtls_platform_zeroize( md5sum, 16 );

    return( ret );
}